

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall lsim::gui::CircuitEditor::draw_grid(CircuitEditor *this,ImDrawList *draw_list)

{
  Point PVar1;
  Point local_a0;
  Point local_98;
  ImVec2 local_90;
  Point local_88;
  Point local_80;
  ImVec2 local_78;
  float local_70;
  float y;
  Point local_64;
  ImVec2 local_5c;
  Point local_54;
  Point local_4c;
  ImVec2 local_44;
  float local_3c;
  ImVec2 IStack_38;
  float x;
  Point local_30;
  Point win_size;
  Point local_20;
  Point win_pos;
  ImDrawList *draw_list_local;
  CircuitEditor *this_local;
  
  if ((this->m_show_grid & 1U) != 0) {
    win_pos = (Point)draw_list;
    win_size = (Point)ImGui::GetCursorScreenPos();
    local_20 = ImVec2::operator_cast_to_Point((ImVec2 *)&win_size);
    IStack_38 = ImGui::GetWindowSize();
    local_30 = ImVec2::operator_cast_to_Point(&stack0xffffffffffffffc8);
    for (local_3c = fmodf((this->m_scroll_delta).x,10.0); PVar1 = win_pos, local_3c < local_30.x;
        local_3c = local_3c + 10.0) {
      Point::Point(&local_54,local_3c,0.0);
      local_4c = Point::operator+(&local_54,&local_20);
      ImVec2::ImVec2(&local_44,&local_4c);
      Point::Point((Point *)&stack0xffffffffffffff94,local_3c,local_30.y);
      local_64 = Point::operator+((Point *)&stack0xffffffffffffff94,&local_20);
      ImVec2::ImVec2(&local_5c,&local_64);
      ImDrawList::AddLine((ImDrawList *)PVar1,&local_44,&local_5c,0x28c8c8c8,1.0);
    }
    for (local_70 = fmodf((this->m_scroll_delta).y,10.0); PVar1 = win_pos, local_70 < local_30.y;
        local_70 = local_70 + 10.0) {
      Point::Point(&local_88,0.0,local_70);
      local_80 = Point::operator+(&local_88,&local_20);
      ImVec2::ImVec2(&local_78,&local_80);
      Point::Point(&local_a0,local_30.x,local_70);
      local_98 = Point::operator+(&local_a0,&local_20);
      ImVec2::ImVec2(&local_90,&local_98);
      ImDrawList::AddLine((ImDrawList *)PVar1,&local_78,&local_90,0x28c8c8c8,1.0);
    }
  }
  return;
}

Assistant:

void CircuitEditor::draw_grid(ImDrawList *draw_list) {
	if (!m_show_grid) {
		return;
	}

	Point win_pos = ImGui::GetCursorScreenPos();
	Point win_size = ImGui::GetWindowSize();

	for (float x = fmodf(m_scroll_delta.x, GRID_SIZE); x < win_size.x; x += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(x, 0.0f) + win_pos, Point(x, win_size.y) + win_pos, COLOR_GRID_LINE);
	}

	for (float y = fmodf(m_scroll_delta.y, GRID_SIZE); y < win_size.y; y += GRID_SIZE) {		// NOLINT
		draw_list->AddLine(Point(0.0f, y) + win_pos, Point(win_size.x, y) + win_pos, COLOR_GRID_LINE);
	}
}